

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# note.c
# Opt level: O3

void note_notify_child(nsync_note n,nsync_note parent)

{
  void *pvVar1;
  nsync_note n_00;
  int iVar2;
  nsync_dll_element_ *pnVar3;
  nsync_dll_list_ pnVar4;
  nsync_time *pnVar5;
  __syscall_slong_t *p_Var6;
  nsync_time a;
  
  if (n->notified == 0) {
    if (n->expiry_time_valid == 0) {
      pnVar5 = &nsync_time_no_deadline;
      p_Var6 = &nsync_time_no_deadline.tv_nsec;
    }
    else {
      pnVar5 = &n->expiry_time;
      p_Var6 = &(n->expiry_time).tv_nsec;
    }
  }
  else {
    p_Var6 = &nsync_time_zero.tv_nsec;
    pnVar5 = &nsync_time_zero;
  }
  a.tv_nsec = *p_Var6;
  a.tv_sec = pnVar5->tv_sec;
  iVar2 = nsync_time_cmp(a,(nsync_time)ZEXT816((ulong)0));
  if (0 < iVar2) {
    n->notified = 1;
    while (pnVar3 = nsync_dll_first_(n->waiters), pnVar3 != (nsync_dll_element_ *)0x0) {
      pvVar1 = pnVar3->container;
      pnVar4 = nsync_dll_remove_(n->waiters,pnVar3);
      n->waiters = pnVar4;
      *(undefined4 *)((long)pvVar1 + 0x20) = 0;
      nsync_mu_semaphore_v(*(nsync_semaphore **)((long)pvVar1 + 0x28));
    }
    pnVar3 = nsync_dll_first_(n->children);
    while (pnVar3 != (nsync_dll_element_ *)0x0) {
      n_00 = (nsync_note)pnVar3->container;
      pnVar3 = nsync_dll_next_(n->children,pnVar3);
      nsync_mu_lock(&n_00->note_mu);
      if (n_00->disconnecting == 0) {
        note_notify_child(n_00,n);
      }
      nsync_mu_unlock(&n_00->note_mu);
    }
    nsync_mu_wait(&n->note_mu,no_children,n,(_func_int_void_ptr_void_ptr *)0x0);
    if (parent != (nsync_note)0x0) {
      pnVar4 = nsync_dll_remove_(parent->children,&n->parent_child_link);
      parent->children = pnVar4;
      n->parent = (nsync_note_s_ *)0x0;
    }
  }
  return;
}

Assistant:

static void note_notify_child (nsync_note n, nsync_note parent) {
	nsync_time t;
	t = NOTIFIED_TIME (n);
	if (nsync_time_cmp (t, nsync_time_zero) > 0) {
		nsync_dll_element_ *p;
		nsync_dll_element_ *next;
		ATM_STORE_REL (&n->notified, 1);
		while ((p = nsync_dll_first_ (n->waiters)) != NULL) {
			struct nsync_waiter_s *nw = DLL_NSYNC_WAITER (p);
			n->waiters = nsync_dll_remove_ (n->waiters, p);
			ATM_STORE_REL (&nw->waiting, 0);
			nsync_mu_semaphore_v (nw->sem);
		}
		for (p = nsync_dll_first_ (n->children); p != NULL; p = next) {
			nsync_note child = DLL_NOTE (p);
			next = nsync_dll_next_ (n->children, p);
			nsync_mu_lock (&child->note_mu);
			if (child->disconnecting == 0) {
				note_notify_child (child, n);
			}
			nsync_mu_unlock (&child->note_mu);
		}
		WAIT_FOR_NO_CHILDREN (no_children, n);
		if (parent != NULL) {
			parent->children = nsync_dll_remove_ (parent->children,
						              &n->parent_child_link);
			WAKEUP_NO_CHILDREN (parent);
			n->parent = NULL;
		}
	}
}